

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int export_tls12_params(ptls_buffer_t *output,int is_server,int session_reused,
                       ptls_cipher_suite_t *cipher,void *client_random,char *server_name,
                       ptls_iovec_t negotiated_protocol,void *enc_key,void *enc_iv,uint64_t enc_seq,
                       uint64_t enc_record_iv,void *dec_key,void *dec_iv,uint64_t dec_seq)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  size_t len;
  ptls_aead_algorithm_t *ppVar4;
  long lVar5;
  ulong uVar6;
  undefined1 local_7a;
  undefined1 local_79;
  ptls_cipher_suite_t *local_78;
  int local_70;
  ushort local_6c [2];
  size_t local_68;
  uint8_t *local_60;
  void *local_58;
  char *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = is_server;
  local_50 = server_name;
  iVar3 = ptls_buffer__do_pushv(output,"",2);
  __s = local_50;
  if (iVar3 == 0) {
    local_68 = negotiated_protocol.len;
    local_60 = negotiated_protocol.base;
    sVar1 = output->off;
    local_79 = (undefined1)local_70;
    local_78 = cipher;
    local_58 = client_random;
    iVar3 = ptls_buffer__do_pushv(output,&local_79,1);
    if (iVar3 == 0) {
      local_7a = (undefined1)session_reused;
      iVar3 = ptls_buffer__do_pushv(output,&local_7a,1);
      if (iVar3 == 0) {
        local_6c[1] = 0x303;
        iVar3 = ptls_buffer__do_pushv(output,local_6c + 1,2);
        if (iVar3 == 0) {
          local_6c[0] = local_78->id << 8 | local_78->id >> 8;
          iVar3 = ptls_buffer__do_pushv(output,local_6c,2);
          if (((iVar3 == 0) && (iVar3 = ptls_buffer__do_pushv(output,local_58,0x20), iVar3 == 0)) &&
             (iVar3 = ptls_buffer__do_pushv(output,"",2), iVar3 == 0)) {
            sVar2 = output->off;
            if (__s == (char *)0x0) {
              len = 0;
            }
            else {
              len = strlen(__s);
            }
            iVar3 = ptls_buffer__do_pushv(output,__s,len);
            if (iVar3 == 0) {
              uVar6 = output->off - sVar2;
              iVar3 = 0x20c;
              if (uVar6 < 0x10000) {
                output->base[sVar2 - 2] = (uint8_t)(uVar6 >> 8);
                output->base[sVar2 - 1] = (uint8_t)uVar6;
                iVar3 = ptls_buffer__do_pushv(output,"",2);
                if (iVar3 == 0) {
                  sVar2 = output->off;
                  iVar3 = ptls_buffer__do_pushv(output,local_60,local_68);
                  if (iVar3 == 0) {
                    uVar6 = output->off - sVar2;
                    if (uVar6 < 0x10000) {
                      output->base[sVar2 - 2] = (uint8_t)(uVar6 >> 8);
                      output->base[sVar2 - 1] = (uint8_t)uVar6;
                      iVar3 = ptls_buffer__do_pushv(output,"",2);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      sVar2 = output->off;
                      iVar3 = ptls_buffer__do_pushv(output,enc_key,local_78->aead->key_size);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      iVar3 = ptls_buffer__do_pushv
                                        (output,enc_iv,(local_78->aead->tls12).fixed_iv_size);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      local_38 = enc_seq >> 0x38 | (enc_seq & 0xff000000000000) >> 0x28 |
                                 (enc_seq & 0xff0000000000) >> 0x18 | (enc_seq & 0xff00000000) >> 8
                                 | (enc_seq & 0xff000000) << 8 | (enc_seq & 0xff0000) << 0x18 |
                                 (enc_seq & 0xff00) << 0x28 | enc_seq << 0x38;
                      iVar3 = ptls_buffer__do_pushv(output,&local_38,8);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      ppVar4 = local_78->aead;
                      if ((ppVar4->tls12).record_iv_size != 0) {
                        local_40 = enc_record_iv >> 0x38 |
                                   (enc_record_iv & 0xff000000000000) >> 0x28 |
                                   (enc_record_iv & 0xff0000000000) >> 0x18 |
                                   (enc_record_iv & 0xff00000000) >> 8 |
                                   (enc_record_iv & 0xff000000) << 8 |
                                   (enc_record_iv & 0xff0000) << 0x18 |
                                   (enc_record_iv & 0xff00) << 0x28 | enc_record_iv << 0x38;
                        iVar3 = ptls_buffer__do_pushv(output,&local_40,8);
                        if (iVar3 != 0) {
                          return iVar3;
                        }
                        ppVar4 = local_78->aead;
                      }
                      iVar3 = ptls_buffer__do_pushv(output,dec_key,ppVar4->key_size);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      iVar3 = ptls_buffer__do_pushv
                                        (output,dec_iv,(local_78->aead->tls12).fixed_iv_size);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      local_48 = dec_seq >> 0x38 | (dec_seq & 0xff000000000000) >> 0x28 |
                                 (dec_seq & 0xff0000000000) >> 0x18 | (dec_seq & 0xff00000000) >> 8
                                 | (dec_seq & 0xff000000) << 8 | (dec_seq & 0xff0000) << 0x18 |
                                 (dec_seq & 0xff00) << 0x28 | dec_seq << 0x38;
                      iVar3 = ptls_buffer__do_pushv(output,&local_48,8);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      uVar6 = output->off - sVar2;
                      if (uVar6 < 0x10000) {
                        output->base[sVar2 - 2] = (uint8_t)(uVar6 >> 8);
                        output->base[sVar2 - 1] = (uint8_t)uVar6;
                        iVar3 = ptls_buffer__do_pushv(output,"",2);
                        if (iVar3 != 0) {
                          return iVar3;
                        }
                        sVar2 = output->off;
                        for (lVar5 = -2; lVar5 != 0; lVar5 = lVar5 + 1) {
                          output->base[lVar5 + sVar2] = '\0';
                        }
                        uVar6 = output->off - sVar1;
                        if (0xffff < uVar6) {
                          return 0x20c;
                        }
                        output->base[sVar1 - 2] = (uint8_t)(uVar6 >> 8);
                        output->base[sVar1 - 1] = (uint8_t)uVar6;
                        return 0;
                      }
                    }
                    iVar3 = 0x20c;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int export_tls12_params(ptls_buffer_t *output, int is_server, int session_reused, ptls_cipher_suite_t *cipher,
                               const void *client_random, const char *server_name, ptls_iovec_t negotiated_protocol,
                               const void *enc_key, const void *enc_iv, uint64_t enc_seq, uint64_t enc_record_iv,
                               const void *dec_key, const void *dec_iv, uint64_t dec_seq)
{
    int ret;

    export_tls_params(output, is_server, session_reused, PTLS_PROTOCOL_VERSION_TLS12, cipher, client_random, server_name,
                      negotiated_protocol, {
                          ptls_buffer_pushv(output, enc_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, enc_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, enc_seq);
                          if (cipher->aead->tls12.record_iv_size != 0)
                              ptls_buffer_push64(output, enc_record_iv);
                          ptls_buffer_pushv(output, dec_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, dec_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, dec_seq);
                      });
    ret = 0;

Exit:
    return ret;
}